

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

ES5ArrayTypeHandlerBase<unsigned_short> * __thiscall
Js::SimpleTypeHandler<2ul>::ConvertToTypeHandler<Js::ES5ArrayTypeHandlerBase<unsigned_short>>
          (SimpleTypeHandler<2ul> *this,DynamicObject *instance)

{
  Type *pTVar1;
  Recycler *this_00;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  PropertyTypes values;
  Recycler *alloc;
  ES5ArrayTypeHandlerBase<unsigned_short> *this_01;
  undefined4 *puVar5;
  Var aValue;
  int i;
  long lVar6;
  SimpleTypeHandler<2ul> *pSVar7;
  undefined1 local_88 [8];
  TrackAllocData data;
  
  pTVar1 = (instance->super_RecyclableObject).type.ptr;
  data._32_8_ = (((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  this_00 = ((ScriptContext *)data._32_8_)->recycler;
  local_88 = (undefined1  [8])&ES5ArrayTypeHandlerBase<unsigned_short>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9ddc672;
  data.filename._0_4_ = 0x87;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_88);
  bVar4 = false;
  this_01 = (ES5ArrayTypeHandlerBase<unsigned_short> *)new<Memory::Recycler>(0x40,alloc,0x37a1d4);
  ES5ArrayTypeHandlerBase<unsigned_short>::ES5ArrayTypeHandlerBase
            (this_01,this_00,*(int *)(this + 0xc),*(uint16 *)(this + 0x12),*(uint16 *)(this + 10));
  bVar3 = DynamicTypeHandler::SetSingletonInstanceIfNeeded((DynamicTypeHandler *)this_01,instance);
  if (bVar3) {
    bVar4 = DynamicObject::HasLockedType(instance);
  }
  pSVar7 = this + 0x20;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  for (lVar6 = 0; lVar6 < *(int *)(this + 0x18); lVar6 = lVar6 + 1) {
    aValue = DynamicObject::GetSlot(instance,(int)lVar6);
    if ((aValue == (Var)0x0) && (0xf < *(uint *)(*(long *)pSVar7 + 8))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                  ,0x95,
                                  "(value != nullptr || IsInternalPropertyId(descriptors[i].Id->GetPropertyId()))"
                                  ,
                                  "value != nullptr || IsInternalPropertyId(descriptors[i].Id->GetPropertyId())"
                                 );
      if (!bVar3) goto LAB_00cc63d6;
      *puVar5 = 0;
    }
    if ((bVar4 == false) || (*(uint *)(*(long *)pSVar7 + 8) < 0x10)) {
LAB_00cc62b9:
      bVar3 = false;
    }
    else {
      bVar3 = VarIs<Js::JavascriptFunction>(aValue);
      if (!bVar3) goto LAB_00cc62b9;
      bVar3 = DynamicTypeHandler::ShouldFixMethodProperties();
    }
    DictionaryTypeHandlerBase<unsigned_short>::Add
              ((DictionaryTypeHandlerBase<unsigned_short> *)this_01,*(PropertyRecord **)pSVar7,
               (PropertyAttributes)pSVar7[8],true,bVar3,false,(ScriptContext *)data._32_8_);
    pSVar7 = pSVar7 + 0x10;
  }
  DynamicTypeHandler::SetFlags((DynamicTypeHandler *)this_01,(byte)this[9] & 0x22);
  if (((this_01->super_DictionaryTypeHandlerBase<unsigned_short>).super_DynamicTypeHandler.
       propertyTypes & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0xa3,"(newTypeHandler->GetIsInlineSlotCapacityLocked())",
                                "newTypeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar3) goto LAB_00cc63d6;
    *puVar5 = 0;
  }
  values = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)this);
  DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)this_01,0xb0,values);
  ES5ArrayTypeHandlerBase<unsigned_short>::SetInstanceTypeHandler(this_01,instance,true);
  if ((bVar4 != false) && ((instance->super_RecyclableObject).type.ptr == pTVar1)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0xa9,"(!allowFixedFields || instance->GetDynamicType() != oldType)"
                                ,"!allowFixedFields || instance->GetDynamicType() != oldType");
    if (!bVar4) {
LAB_00cc63d6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return this_01;
}

Assistant:

T* SimpleTypeHandler<size>::ConvertToTypeHandler(DynamicObject* instance)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

#if ENABLE_FIXED_FIELDS && DBG
        DynamicType* oldType = instance->GetDynamicType();
#endif

        T* newTypeHandler = RecyclerNew(recycler, T, recycler, SimpleTypeHandler<size>::GetSlotCapacity(), GetInlineSlotCapacity(), GetOffsetOfInlineSlots());
#if ENABLE_FIXED_FIELDS
        Assert(HasSingletonInstanceOnlyIfNeeded());

        bool const hasSingletonInstance = newTypeHandler->SetSingletonInstanceIfNeeded(instance);
        // If instance has a shared type, the type handler change below will induce a type transition, which
        // guarantees that any existing fast path field stores (which could quietly overwrite a fixed field
        // on this instance) will be invalidated.  It is safe to mark all fields as fixed.
        bool const allowFixedFields = hasSingletonInstance && instance->HasLockedType();
#endif

        for (int i = 0; i < propertyCount; i++)
        {
            Var value = instance->GetSlot(i);
            Assert(value != nullptr || IsInternalPropertyId(descriptors[i].Id->GetPropertyId()));
#if ENABLE_FIXED_FIELDS
            bool markAsFixed = allowFixedFields && !IsInternalPropertyId(descriptors[i].Id->GetPropertyId()) &&
                (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : false);
#else
            bool markAsFixed = false;
#endif
            newTypeHandler->Add(PointerValue(descriptors[i].Id), descriptors[i].Attributes, true, markAsFixed, false, scriptContext);
        }

        newTypeHandler->SetFlags(IsPrototypeFlag | HasKnownSlot0Flag, this->GetFlags());
        // We don't expect to convert to a PathTypeHandler.  If we change this later we need to review if we want the new type handler to have locked
        // inline slot capacity, or if we want to allow shrinking of the SimpleTypeHandler's inline slot capacity.
        Assert(!newTypeHandler->IsPathTypeHandler());
        Assert(newTypeHandler->GetIsInlineSlotCapacityLocked());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);

#if ENABLE_FIXED_FIELDS && DBG
        // If we marked fields as fixed we had better forced a type transition.
        Assert(!allowFixedFields || instance->GetDynamicType() != oldType);
#endif

        return newTypeHandler;
    }